

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToFile(int auto_open_depth,char *filename)

{
  ImGuiContext *pIVar1;
  ImFileHandle pFVar2;
  char *in_RSI;
  int in_EDI;
  ImFileHandle f;
  ImGuiContext *g;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  char *local_10;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled & 1U) == 0) {
    local_10 = in_RSI;
    if (in_RSI == (char *)0x0) {
      local_10 = (GImGui->IO).LogFilename;
    }
    if (((local_10 != (char *)0x0) && (*local_10 != '\0')) &&
       (pFVar2 = ImFileOpen(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8),
       pFVar2 != (ImFileHandle)0x0)) {
      LogBegin(ImGuiLogType_File,in_EDI);
      pIVar1->LogFile = pFVar2;
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int auto_open_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;

    // FIXME: We could probably open the file in text mode "at", however note that clipboard/buffer logging will still
    // be subject to outputting OS-incompatible carriage return if within strings the user doesn't use IM_NEWLINE.
    // By opening the file in binary mode "ab" we have consistent output everywhere.
    if (!filename)
        filename = g.IO.LogFilename;
    if (!filename || !filename[0])
        return;
    ImFileHandle f = ImFileOpen(filename, "ab");
    if (!f)
    {
        IM_ASSERT(0);
        return;
    }

    LogBegin(ImGuiLogType_File, auto_open_depth);
    g.LogFile = f;
}